

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(SessionHandle *data)

{
  connectdata *pcVar1;
  curl_llist *pcVar2;
  char *pcVar3;
  _Bool _Var4;
  timeval tVar5;
  __time_t local_30;
  __suseconds_t local_28;
  connectdata *conn;
  SessionHandle *data_local;
  
  pcVar1 = (connectdata *)(*Curl_ccalloc)(1,0x5a0);
  if (pcVar1 == (connectdata *)0x0) {
    return (connectdata *)0x0;
  }
  pcVar1->handler = &Curl_handler_dummy;
  pcVar1->sock[0] = -1;
  pcVar1->sock[1] = 0xffffffff;
  pcVar1->tempsock[0] = -1;
  pcVar1->tempsock[1] = 0xffffffff;
  pcVar1->connection_id = -1;
  *(long *)(pcVar1->ip_addr_str + 0x78) = -1;
  *(int *)(pcVar1->ip_addr_str + 0x80) = -1;
  (pcVar1->bits).close = true;
  tVar5 = curlx_tvnow();
  local_30 = tVar5.tv_sec;
  (pcVar1->created).tv_sec = local_30;
  local_28 = tVar5.tv_usec;
  (pcVar1->created).tv_usec = local_28;
  pcVar1->data = data;
  *(curl_proxytype *)(pcVar1->ip_addr_str + 0x128) = (data->set).proxytype;
  _Var4 = false;
  if ((data->set).str[0xf] != (char *)0x0) {
    _Var4 = *(data->set).str[0xf] != '\0';
  }
  (pcVar1->bits).proxy = _Var4;
  _Var4 = false;
  if ((((pcVar1->bits).proxy & 1U) != 0) &&
     (_Var4 = true, *(curl_proxytype *)(pcVar1->ip_addr_str + 0x128) != CURLPROXY_HTTP)) {
    _Var4 = *(curl_proxytype *)(pcVar1->ip_addr_str + 0x128) == CURLPROXY_HTTP_1_0;
  }
  (pcVar1->bits).httpproxy = _Var4;
  (pcVar1->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
  (pcVar1->bits).tunnel_proxy = (_Bool)((data->set).tunnel_thru_httpproxy & 1);
  (pcVar1->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar1->bits).ftp_use_epsv = (_Bool)((data->set).ftp_use_epsv & 1);
  (pcVar1->bits).ftp_use_eprt = (_Bool)((data->set).ftp_use_eprt & 1);
  pcVar1->verifypeer = (_Bool)((data->set).ssl.verifypeer & 1);
  pcVar1->verifyhost = (_Bool)((data->set).ssl.verifyhost & 1);
  pcVar1->ip_version = (data->set).ipver;
  _Var4 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var4) && (pcVar1->master_buffer == (char *)0x0)) {
    pcVar3 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar1->master_buffer = pcVar3;
    if (pcVar1->master_buffer == (char *)0x0) goto LAB_008a04ab;
  }
  pcVar2 = Curl_llist_alloc(llist_dtor);
  pcVar1->send_pipe = pcVar2;
  pcVar2 = Curl_llist_alloc(llist_dtor);
  pcVar1->recv_pipe = pcVar2;
  if ((pcVar1->send_pipe != (curl_llist *)0x0) && (pcVar1->recv_pipe != (curl_llist *)0x0)) {
    if ((data->set).str[5] != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)((data->set).str[5]);
      pcVar1->localdev = pcVar3;
      if (pcVar1->localdev == (char *)0x0) goto LAB_008a04ab;
    }
    pcVar1->localportrange = (data->set).localportrange;
    pcVar1->localport = (data->set).localport;
    pcVar1->fclosesocket = (data->set).fclosesocket;
    pcVar1->closesocket_client = (data->set).closesocket_client;
    return pcVar1;
  }
LAB_008a04ab:
  Curl_llist_destroy(pcVar1->send_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar1->recv_pipe,(void *)0x0);
  pcVar1->send_pipe = (curl_llist *)0x0;
  pcVar1->recv_pipe = (curl_llist *)0x0;
  (*Curl_cfree)(pcVar1->master_buffer);
  (*Curl_cfree)(pcVar1->localdev);
  (*Curl_cfree)(pcVar1);
  return (connectdata *)0x0;
}

Assistant:

static struct connectdata *allocate_conn(struct SessionHandle *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

  conn->handler = &Curl_handler_dummy;  /* Be sure we have a handler defined
                                           already from start to avoid NULL
                                           situations and checks */

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[0] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[1] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->connection_id = -1;    /* no ID */
  conn->port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown */

  /* Default protocol-independent behavior doesn't support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_tvnow();

  conn->data = data; /* Setup the association between this connection
                        and the SessionHandle */

  conn->proxytype = data->set.proxytype; /* type */

#ifdef CURL_DISABLE_PROXY

  conn->bits.proxy = FALSE;
  conn->bits.httpproxy = FALSE;
  conn->bits.proxy_user_passwd = FALSE;
  conn->bits.tunnel_proxy = FALSE;

#else /* CURL_DISABLE_PROXY */

  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY])?TRUE:FALSE;
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->proxytype == CURLPROXY_HTTP ||
                           conn->proxytype == CURLPROXY_HTTP_1_0))?TRUE:FALSE;
  conn->bits.proxy_user_passwd =
    (NULL != data->set.str[STRING_PROXYUSERNAME])?TRUE:FALSE;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;

#endif /* CURL_DISABLE_PROXY */

  conn->bits.user_passwd = (NULL != data->set.str[STRING_USERNAME])?TRUE:FALSE;
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;

  conn->verifypeer = data->set.ssl.verifypeer;
  conn->verifyhost = data->set.ssl.verifyhost;

  conn->ip_version = data->set.ipver;

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM) && \
    defined(NTLM_WB_ENABLED)
  conn->ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
  conn->ntlm_auth_hlpr_pid = 0;
  conn->challenge_header = NULL;
  conn->response_header = NULL;
#endif

  if(Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
     !conn->master_buffer) {
    /* Allocate master_buffer to be used for HTTP/1 pipelining */
    conn->master_buffer = calloc(BUFSIZE, sizeof (char));
    if(!conn->master_buffer)
      goto error;
  }

  /* Initialize the pipeline lists */
  conn->send_pipe = Curl_llist_alloc((curl_llist_dtor) llist_dtor);
  conn->recv_pipe = Curl_llist_alloc((curl_llist_dtor) llist_dtor);
  if(!conn->send_pipe || !conn->recv_pipe)
    goto error;

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) SessionHandle */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;

  return conn;
  error:

  Curl_llist_destroy(conn->send_pipe, NULL);
  Curl_llist_destroy(conn->recv_pipe, NULL);

  conn->send_pipe = NULL;
  conn->recv_pipe = NULL;

  free(conn->master_buffer);
  free(conn->localdev);
  free(conn);
  return NULL;
}